

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

void mat_inf_norm_cols(csc *M,c_float *E)

{
  c_float local_38;
  c_float local_30;
  double local_28;
  c_int ptr;
  c_int j;
  c_float *E_local;
  csc *M_local;
  
  for (j = 0; j < M->n; j = j + 1) {
    E[j] = 0.0;
  }
  for (j = 0; j < M->n; j = j + 1) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr = ptr + 1) {
      if (0.0 < M->x[ptr] || M->x[ptr] == 0.0) {
        local_28 = M->x[ptr];
      }
      else {
        local_28 = -M->x[ptr];
      }
      if (local_28 < E[j] || local_28 == E[j]) {
        local_38 = E[j];
      }
      else {
        if (0.0 < M->x[ptr] || M->x[ptr] == 0.0) {
          local_30 = M->x[ptr];
        }
        else {
          local_30 = -M->x[ptr];
        }
        local_38 = local_30;
      }
      E[j] = local_38;
    }
  }
  return;
}

Assistant:

void mat_inf_norm_cols(const csc *M, c_float *E) {
  c_int j, ptr;

  // Initialize zero max elements
  for (j = 0; j < M->n; j++) {
    E[j] = 0.;
  }

  // Compute maximum across columns
  for (j = 0; j < M->n; j++) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      E[j] = c_max(c_absval(M->x[ptr]), E[j]);
    }
  }
}